

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::detail::ReferenceResolver::_store_anchors_and_refs(ReferenceResolver *this,size_t n)

{
  NodeType_e NVar1;
  code *pcVar2;
  ro_substr pattern;
  ro_substr pattern_00;
  bool bVar3;
  int iVar4;
  NodeData *pNVar5;
  csubstr *pcVar6;
  csubstr *pcVar7;
  size_t sVar8;
  size_t sVar9;
  undefined1 local_60 [32];
  undefined8 local_40;
  size_t sStack_38;
  
  pNVar5 = Tree::_p(this->t,n);
  if ((((pNVar5->m_type).type & KEYREF) == NOTYPE) &&
     (pNVar5 = Tree::_p(this->t,n), ((pNVar5->m_type).type & VALREF) == NOTYPE)) {
    pNVar5 = Tree::_p(this->t,n);
    if (((pNVar5->m_type).type & KEY) == NOTYPE) goto LAB_001dbf77;
    pcVar6 = Tree::key(this->t,n);
    iVar4 = basic_substring<const_char>::compare(pcVar6,"<<",2);
    if (iVar4 != 0) goto LAB_001dbf77;
  }
  pNVar5 = Tree::_p(this->t,n);
  if (((pNVar5->m_type).type & SEQ) != NOTYPE) {
    sVar8 = Tree::first_child(this->t,n);
    do {
      if (sVar8 == 0xffffffffffffffff) {
        return;
      }
      sVar9 = Tree::num_children(this->t,sVar8);
      if (sVar9 != 0) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        join_0x00000010_0x00000000_ =
             to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
        local_60._0_8_ = NOTYPE;
        local_60._8_8_ = 0x66c0;
        local_60._16_8_ = 0;
        (*(code *)PTR_error_impl_00231528)
                  ("check failed: t->num_children(ich) == 0",0x27,
                   (anonymous_namespace)::s_default_callbacks);
      }
      local_60._0_8_ = VALREF;
      local_60._16_8_ = 0xffffffffffffffff;
      local_40 = n;
      local_60._24_8_ = 0xffffffffffffffff;
      local_60._8_8_ = sVar8;
      sStack_38 = Tree::next_sibling(this->t,n);
      stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push
                (&this->refs,(refdata *)local_60);
      sVar8 = Tree::next_sibling(this->t,sVar8);
    } while( true );
  }
  pNVar5 = Tree::_p(this->t,n);
  if (((pNVar5->m_type).type & KEYREF) != NOTYPE) {
    pcVar6 = Tree::key(this->t,n);
    iVar4 = basic_substring<const_char>::compare(pcVar6,"<<",2);
    if (iVar4 != 0) {
      pNVar5 = Tree::_p(this->t,n);
      if (((pNVar5->m_type).type & KEY) != NOTYPE) {
        pcVar6 = Tree::key(this->t,n);
        pcVar7 = Tree::key_ref(this->t,n);
        pattern.str = pcVar7->str;
        pattern.len = pcVar7->len;
        bVar3 = basic_substring<const_char>::ends_with(pcVar6,pattern);
        if (!bVar3) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          join_0x00000010_0x00000000_ =
               to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
          local_60._0_8_ = NOTYPE;
          local_60._8_8_ = 0x66c7;
          local_60._16_8_ = 0;
          (*(code *)PTR_error_impl_00231528)
                    ("check failed: (!t->has_key(n)) || t->key(n).ends_with(t->key_ref(n))",0x44,
                     (anonymous_namespace)::s_default_callbacks);
        }
      }
      local_60._0_8_ = KEYREF;
      local_60._16_8_ = 0xffffffffffffffff;
      local_40._0_4_ = 0xffffffff;
      local_60._24_8_ = 0xffffffffffffffff;
      local_40._4_4_ = 0xffffffff;
      sStack_38 = 0xffffffffffffffff;
      local_60._8_8_ = n;
      stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push
                (&this->refs,(refdata *)local_60);
    }
  }
  pNVar5 = Tree::_p(this->t,n);
  if (((pNVar5->m_type).type & VALREF) != NOTYPE) {
    pNVar5 = Tree::_p(this->t,n);
    if (((pNVar5->m_type).type & VAL) != NOTYPE) {
      pcVar6 = Tree::val(this->t,n);
      pcVar7 = Tree::val_ref(this->t,n);
      pattern_00.str = pcVar7->str;
      pattern_00.len = pcVar7->len;
      bVar3 = basic_substring<const_char>::ends_with(pcVar6,pattern_00);
      if (!bVar3) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        join_0x00000010_0x00000000_ =
             to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
        local_60._0_8_ = NOTYPE;
        local_60._8_8_ = 0x66cc;
        local_60._16_8_ = 0;
        (*(code *)PTR_error_impl_00231528)
                  ("check failed: (!t->has_val(n)) || t->val(n).ends_with(t->val_ref(n))",0x44,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    local_60._0_8_ = VALREF;
    local_60._16_8_ = 0xffffffffffffffff;
    local_40._0_4_ = 0xffffffff;
    local_60._24_8_ = 0xffffffffffffffff;
    local_40._4_4_ = 0xffffffff;
    sStack_38 = 0xffffffffffffffff;
    local_60._8_8_ = n;
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push(&this->refs,(refdata *)local_60);
  }
LAB_001dbf77:
  pNVar5 = Tree::_p(this->t,n);
  if ((~(int)(pNVar5->m_type).type & 0x102U) == 0) {
    pNVar5 = Tree::_p(this->t,n);
    if (((pNVar5->m_type).type & KEY) == NOTYPE) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      join_0x00000010_0x00000000_ =
           to_csubstr(
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     );
      local_60._0_8_ = NOTYPE;
      local_60._8_8_ = 0x66d2;
      local_60._16_8_ = 0;
      (*(code *)PTR_error_impl_00231528)
                ("check failed: t->has_key(n)",0x1b,(anonymous_namespace)::s_default_callbacks);
    }
    local_60._0_8_ = KEYANCH;
    local_60._16_8_ = 0xffffffffffffffff;
    local_40._0_4_ = 0xffffffff;
    local_60._24_8_ = 0xffffffffffffffff;
    local_40._4_4_ = 0xffffffff;
    sStack_38 = 0xffffffffffffffff;
    local_60._8_8_ = n;
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push(&this->refs,(refdata *)local_60);
  }
  pNVar5 = Tree::_p(this->t,n);
  NVar1 = (pNVar5->m_type).type;
  if ((NVar1 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar1 >> 9 & 1) != 0) {
    pNVar5 = Tree::_p(this->t,n);
    if ((((pNVar5->m_type).type & VAL) == NOTYPE) &&
       (pNVar5 = Tree::_p(this->t,n), ((pNVar5->m_type).type & (STREAM|MAP)) == NOTYPE)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      join_0x00000010_0x00000000_ =
           to_csubstr(
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     );
      local_60._0_8_ = NOTYPE;
      local_60._8_8_ = 0x66d7;
      local_60._16_8_ = 0;
      (*(code *)PTR_error_impl_00231528)
                ("check failed: t->has_val(n) || t->is_container(n)",0x31,
                 (anonymous_namespace)::s_default_callbacks);
    }
    local_60._0_8_ = VALANCH;
    local_60._16_8_ = 0xffffffffffffffff;
    local_40._0_4_ = 0xffffffff;
    local_60._24_8_ = 0xffffffffffffffff;
    local_40._4_4_ = 0xffffffff;
    sStack_38 = 0xffffffffffffffff;
    local_60._8_8_ = n;
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push(&this->refs,(refdata *)local_60);
  }
  for (sVar8 = Tree::first_child(this->t,n); sVar8 != 0xffffffffffffffff;
      sVar8 = Tree::next_sibling(this->t,sVar8)) {
    _store_anchors_and_refs(this,sVar8);
  }
  return;
}

Assistant:

void _store_anchors_and_refs(size_t n)
    {
        if(t->is_key_ref(n) || t->is_val_ref(n) || (t->has_key(n) && t->key(n) == "<<"))
        {
            if(t->is_seq(n))
            {
                // for merging multiple inheritance targets
                //   <<: [ *CENTER, *BIG ]
                for(size_t ich = t->first_child(n); ich != NONE; ich = t->next_sibling(ich))
                {
                    RYML_ASSERT(t->num_children(ich) == 0);
                    refs.push({VALREF, ich, npos, npos, n, t->next_sibling(n)});
                }
                return;
            }
            if(t->is_key_ref(n) && t->key(n) != "<<") // insert key refs BEFORE inserting val refs
            {
                RYML_CHECK((!t->has_key(n)) || t->key(n).ends_with(t->key_ref(n)));
                refs.push({KEYREF, n, npos, npos, NONE, NONE});
            }
            if(t->is_val_ref(n))
            {
                RYML_CHECK((!t->has_val(n)) || t->val(n).ends_with(t->val_ref(n)));
                refs.push({VALREF, n, npos, npos, NONE, NONE});
            }
        }
        if(t->has_key_anchor(n))
        {
            RYML_CHECK(t->has_key(n));
            refs.push({KEYANCH, n, npos, npos, NONE, NONE});
        }
        if(t->has_val_anchor(n))
        {
            RYML_CHECK(t->has_val(n) || t->is_container(n));
            refs.push({VALANCH, n, npos, npos, NONE, NONE});
        }
        for(size_t ch = t->first_child(n); ch != NONE; ch = t->next_sibling(ch))
        {
            _store_anchors_and_refs(ch);
        }
    }